

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t::
red_stack_entry_t(red_stack_entry_t *this,node_sptr_t *n,
                 range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                 *r)

{
  (this->n)._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                  *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&this->n,n->_t);
  (this->current)._edge._t =
       (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
        *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&(this->current)._edge,(r->_begin)._edge._t);
  (this->end)._edge._t =
       (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
        *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&(this->end)._edge,(r->_end)._edge._t);
  return;
}

Assistant:

red_stack_entry_t(node_sptr_t & n, tchecker::range_t<typename GRAPH::outgoing_edges_iterator_t> const & r)
        : n(n), current(r.begin()), end(r.end())
    {
    }